

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O1

void __thiscall
license::Project::exportPublicKey
          (Project *this,string *include_folder,
          unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>
          *cryptoHelper)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  value_t vVar2;
  pointer pcVar3;
  json_value jVar4;
  pointer *ppBVar5;
  reference pvVar6;
  Environment env;
  json data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pkey;
  Template temp;
  path templates_path;
  Environment local_110;
  undefined1 local_108 [8];
  json_value local_100;
  string local_f8;
  undefined1 local_d8 [8];
  json_value local_d0;
  uchar *local_c8;
  uchar *local_c0;
  undefined1 local_b0 [8];
  json_value local_a8;
  undefined1 local_a0 [8];
  json_value local_98;
  Template local_90;
  undefined1 *local_58;
  long local_50;
  undefined1 local_48 [16];
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_38;
  
  local_58 = local_48;
  pcVar3 = (this->m_templates_folder)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar3,pcVar3 + (this->m_templates_folder)._M_string_length);
  ppBVar5 = &local_90.bytecodes.super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_90.bytecodes.super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)ppBVar5;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_58,local_58 + local_50);
  std::__cxx11::string::append((char *)&local_90);
  paVar1 = &local_f8.field_2;
  pcVar3 = (include_folder->_M_dataplus)._M_p;
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar3,pcVar3 + include_folder->_M_string_length);
  std::__cxx11::string::append((char *)&local_f8);
  inja::Environment::Environment(&local_110,(string *)&local_90,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if (local_90.bytecodes.super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)ppBVar5) {
    operator_delete(local_90.bytecodes.
                    super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"public_key.inja","");
  inja::Environment::parse_template(&local_90,&local_110,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  local_108[0] = null;
  local_100.object = (object_t *)0x0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_108);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_108);
  (*((cryptoHelper->_M_t).
     super___uniq_ptr_impl<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>._M_t.
     super__Tuple_impl<0UL,_license::CryptoHelper_*,_std::default_delete<license::CryptoHelper>_>.
     super__Head_base<0UL,_license::CryptoHelper_*,_false>._M_head_impl)->_vptr_CryptoHelper[2])
            (&local_c8);
  local_d0.object = (object_t *)0x0;
  local_d8[0] = array;
  local_f8._M_dataplus._M_p = (pointer)local_c8;
  local_38._M_current = local_c0;
  local_d0.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::
       create<std::vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                 ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&local_f8,&local_38);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_d8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_d8);
  pvVar6 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)local_108,"public_key");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_d8);
  vVar2 = pvVar6->m_type;
  pvVar6->m_type = local_d8[0];
  jVar4 = pvVar6->m_value;
  (pvVar6->m_value).object = (object_t *)local_d0;
  local_d8[0] = vVar2;
  local_d0 = jVar4;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(pvVar6);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_d8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy
            ((json_value *)
             &((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_d8)->m_value,local_d8[0]);
  local_98.object = (object_t *)(local_c0 + -(long)local_c8);
  local_a0[0] = number_unsigned;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_a0);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_a0);
  pvVar6 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)local_108,"public_key_len");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_a0);
  vVar2 = pvVar6->m_type;
  pvVar6->m_type = local_a0[0];
  jVar4 = pvVar6->m_value;
  (pvVar6->m_value).object = (object_t *)local_98;
  local_a0[0] = vVar2;
  local_98 = jVar4;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(pvVar6);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_a0);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy
            ((json_value *)
             &((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_a0)->m_value,local_a0[0]);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)local_b0,&this->m_name);
  pvVar6 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)local_108,"product_name");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_b0);
  vVar2 = pvVar6->m_type;
  pvVar6->m_type = local_b0[0];
  jVar4 = pvVar6->m_value;
  pvVar6->m_value = local_a8;
  local_b0[0] = vVar2;
  local_a8 = jVar4;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(pvVar6);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_b0);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy
            ((json_value *)
             &((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_b0)->m_value,local_b0[0]);
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"public_key.h","");
  inja::Environment::write
            (&local_110,(int)&local_90,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)local_108,(size_t)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if (local_c8 != (uchar *)0x0) {
    operator_delete(local_c8);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_108);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy
            ((json_value *)
             &((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_108)->m_value,local_108[0]);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.content._M_dataplus._M_p != &local_90.content.field_2) {
    operator_delete(local_90.content._M_dataplus._M_p);
  }
  std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::~vector(&local_90.bytecodes);
  if (local_110.m_impl._M_t.
      super___uniq_ptr_impl<inja::Environment::Impl,_std::default_delete<inja::Environment::Impl>_>.
      _M_t.
      super__Tuple_impl<0UL,_inja::Environment::Impl_*,_std::default_delete<inja::Environment::Impl>_>
      .super__Head_base<0UL,_inja::Environment::Impl_*,_false>._M_head_impl !=
      (__uniq_ptr_data<inja::Environment::Impl,_std::default_delete<inja::Environment::Impl>,_true,_true>
       )0x0) {
    std::default_delete<inja::Environment::Impl>::operator()
              ((default_delete<inja::Environment::Impl> *)&local_110,
               (Impl *)local_110.m_impl._M_t.
                       super___uniq_ptr_impl<inja::Environment::Impl,_std::default_delete<inja::Environment::Impl>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_inja::Environment::Impl_*,_std::default_delete<inja::Environment::Impl>_>
                       .super__Head_base<0UL,_inja::Environment::Impl_*,_false>._M_head_impl);
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  return;
}

Assistant:

void Project::exportPublicKey(const std::string &include_folder, const std::unique_ptr<CryptoHelper> &cryptoHelper) {
	const fs::path templates_path(m_templates_folder);
	Environment env(templates_path.string() + "/", include_folder + "/");
	Template temp = env.parse_template(TEMPLATE);
	json data;
	const vector<unsigned char> pkey = cryptoHelper->exportPublicKey();
	data["public_key"] = pkey;
	data["public_key_len"] = pkey.size();
	data["product_name"] = m_name;
	env.write(temp, data, PUBLIC_KEY_INC_FNAME);
}